

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

size_t LocalizedText_calcSizeBinary(UA_LocalizedText *src,UA_DataType *_)

{
  size_t sVar1;
  size_t local_20;
  size_t s;
  UA_DataType *__local;
  UA_LocalizedText *src_local;
  
  local_20 = 1;
  if ((src->locale).data != (UA_Byte *)0x0) {
    local_20 = String_calcSizeBinary(&src->locale,(UA_DataType *)0x0);
    local_20 = local_20 + 1;
  }
  if ((src->text).data != (UA_Byte *)0x0) {
    sVar1 = String_calcSizeBinary(&src->text,(UA_DataType *)0x0);
    local_20 = sVar1 + local_20;
  }
  return local_20;
}

Assistant:

static size_t
LocalizedText_calcSizeBinary(const UA_LocalizedText *src, UA_DataType *_) {
    size_t s = 1; // encoding byte
    if(src->locale.data)
        s += String_calcSizeBinary(&src->locale, NULL);
    if(src->text.data)
        s += String_calcSizeBinary(&src->text, NULL);
    return s;
}